

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::iterate(PartialUpdateTest *this)

{
  allocator<int> *this_00;
  TestContext *pTVar1;
  EGLDisplay pvVar2;
  EGLSurface pvVar3;
  ReferenceRenderer *this_01;
  bool bVar4;
  bool bVar5;
  EGLint width_00;
  EGLint height_00;
  deUint32 dVar6;
  deBool dVar7;
  Library *egl_00;
  TestLog *log_00;
  ostream *poVar8;
  char *pcVar9;
  reference pvVar10;
  size_type sVar11;
  reference piVar12;
  reference frame;
  int iVar13;
  float x_;
  float y_;
  float z_;
  allocator<char> local_359;
  string local_358 [8];
  string errorMessage;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_330;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_328;
  const_iterator it;
  vector<int,_std::allocator<int>_> framesOnBuffer;
  vector<int,_std::allocator<int>_> local_300;
  vector<int,_std::allocator<int>_> local_2e8;
  vector<int,_std::allocator<int>_> local_2d0;
  undefined1 local_2b8 [8];
  vector<int,_std::allocator<int>_> damageRegion;
  string local_298 [32];
  undefined1 local_278 [8];
  ostringstream stream;
  undefined1 local_f8 [4];
  EGLint currentBufferAge;
  Frame newFrame;
  Surface refBuffer;
  Surface currentBuffer;
  int frameNdx;
  bool hasPositiveAge;
  vector<int,_std::allocator<int>_> bufferAges;
  FrameSequence frameSequence;
  int numFrames;
  Vec4 clearColor;
  float clearBlue;
  float clearGreen;
  float clearRed;
  int height;
  int width;
  TestLog *log;
  Library *egl;
  Random rnd;
  PartialUpdateTest *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)&egl,this->m_seed);
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  width_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3057);
  height_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3056);
  x_ = de::Random::getFloat((Random *)&egl);
  y_ = de::Random::getFloat((Random *)&egl);
  z_ = de::Random::getFloat((Random *)&egl);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             ((long)&frameSequence.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),x_,y_,z_,1.0);
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x14;
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
            *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&frameNdx);
  bVar4 = false;
  do {
    (*egl_00->_vptr_Library[0x30])(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
    dVar6 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar6,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                     ,499);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  for (currentBuffer.m_pixels.m_cap._0_4_ = 0; (int)currentBuffer.m_pixels.m_cap < 0x14;
      currentBuffer.m_pixels.m_cap._0_4_ = (int)currentBuffer.m_pixels.m_cap + 1) {
    tcu::Surface::Surface((Surface *)&refBuffer.m_pixels.m_cap,width_00,height_00);
    tcu::Surface::Surface
              ((Surface *)
               &newFrame.draws.
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,width_00,height_00);
    Frame::Frame((Frame *)local_f8,width_00,height_00);
    stream._372_4_ = 0xffffffff;
    if ((int)currentBuffer.m_pixels.m_cap % 2 == 0) {
      generateRandomFrame((Frame *)local_f8,&this->m_evenFrameDrawType,(Random *)&egl);
    }
    else {
      generateRandomFrame((Frame *)local_f8,&this->m_oddFrameDrawType,(Random *)&egl);
    }
    std::
    vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ::push_back((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type *)local_f8);
    do {
      (*egl_00->_vptr_Library[0x2b])
                (egl_00,this->m_eglDisplay,this->m_eglSurface,0x313d,&stream.field_0x174);
      dVar6 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar6,
                       "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                       ,0x203);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    if (((int)currentBuffer.m_pixels.m_cap < (int)stream._372_4_) || ((int)stream._372_4_ < 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      poVar8 = std::operator<<((ostream *)local_278,"Fail, the age is invalid. Age: ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,stream._372_4_);
      poVar8 = std::operator<<(poVar8,", frameNdx: ");
      std::ostream::operator<<(poVar8,(int)currentBuffer.m_pixels.m_cap);
      pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::ostringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,pcVar9);
      std::__cxx11::string::~string(local_298);
      this_local._4_4_ = STOP;
      damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&frameNdx,
                 (value_type_conflict1 *)&stream.field_0x174);
      if ((int)stream._372_4_ < 1) {
        do {
          (*egl_00->_vptr_Library[0x2e])(egl_00,this->m_eglDisplay,this->m_eglSurface,0);
          dVar6 = (*egl_00->_vptr_Library[0x1f])();
          eglu::checkError(dVar6,"setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                           ,0x227);
          dVar7 = ::deGetFalse();
        } while (dVar7 != 0);
        clearColorScreen(&this->m_gl,
                         (Vec4 *)((long)&frameSequence.
                                         super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2b8);
        bVar4 = true;
        if ((this->m_supportBufferAge & 1U) == 0) {
          getDamageRegion(&local_2e8,(Frame *)local_f8,0,0,0,0);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)local_2b8,&local_2e8);
          std::vector<int,_std::allocator<int>_>::~vector(&local_2e8);
          sVar11 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)local_2b8);
          if (sVar11 == 0) {
            framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            this_00 = (allocator<int> *)
                      ((long)&framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 3);
            std::allocator<int>::allocator(this_00);
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_300,4,
                       (value_type_conflict1 *)
                       ((long)&framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4),this_00);
            std::vector<int,_std::allocator<int>_>::operator=
                      ((vector<int,_std::allocator<int>_> *)local_2b8,&local_300);
            std::vector<int,_std::allocator<int>_>::~vector(&local_300);
            std::allocator<int>::~allocator
                      ((allocator<int> *)
                       ((long)&framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 3));
          }
        }
        else {
          getDamageRegion(&local_2d0,(Frame *)local_f8,10,10,10,10);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)local_2b8,&local_2d0);
          std::vector<int,_std::allocator<int>_>::~vector(&local_2d0);
        }
        do {
          pvVar2 = this->m_eglDisplay;
          pvVar3 = this->m_eglSurface;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_2b8,0);
          sVar11 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)local_2b8);
          iVar13 = (int)sVar11;
          if (iVar13 < 0) {
            iVar13 = iVar13 + 3;
          }
          (*egl_00->_vptr_Library[0x2e])(egl_00,pvVar2,pvVar3,pvVar10,(ulong)(uint)(iVar13 >> 2));
          dVar6 = (*egl_00->_vptr_Library[0x1f])();
          eglu::checkError(dVar6,
                           "setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                           ,0x223);
          dVar7 = ::deGetFalse();
        } while (dVar7 != 0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_2b8);
      }
      if ((int)currentBuffer.m_pixels.m_cap < 10) {
        GLES2Renderer::render(this->m_gles2Renderer,width_00,height_00,(Frame *)local_f8);
      }
      else {
        getFramesOnBuffer((vector<int,_std::allocator<int>_> *)&it,
                          (vector<int,_std::allocator<int>_> *)&frameNdx,
                          (int)currentBuffer.m_pixels.m_cap);
        clearColorReference((Surface *)
                            &newFrame.draws.
                             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (Vec4 *)((long)&frameSequence.
                                            super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
        ;
        local_328._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&it);
        while( true ) {
          local_330._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&it);
          bVar5 = __gnu_cxx::operator!=(&local_328,&local_330);
          if (!bVar5) break;
          this_01 = this->m_refRenderer;
          piVar12 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_328);
          frame = std::
                  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                  ::operator[]((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,(long)*piVar12);
          ReferenceRenderer::render
                    (this_01,(Surface *)
                             &newFrame.draws.
                              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,frame);
          errorMessage.field_2._8_8_ =
               __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&local_328,0);
        }
        GLES2Renderer::render(this->m_gles2Renderer,width_00,height_00,(Frame *)local_f8);
        ReferenceRenderer::render
                  (this->m_refRenderer,
                   (Surface *)
                   &newFrame.draws.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Frame *)local_f8);
        anon_unknown_0::readPixels(&this->m_gl,(Surface *)&refBuffer.m_pixels.m_cap);
        bVar5 = compareToReference(log_00,(Surface *)
                                          &newFrame.draws.
                                           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (Surface *)&refBuffer.m_pixels.m_cap,
                                   (int)currentBuffer.m_pixels.m_cap,
                                   (int)currentBuffer.m_pixels.m_cap);
        if (bVar5) {
          damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_358,"Fail, render result is wrong. Buffer age is ",&local_359);
          std::allocator<char>::~allocator(&local_359);
          pcVar9 = "not supported";
          if ((this->m_supportBufferAge & 1U) != 0) {
            pcVar9 = "supported";
          }
          std::__cxx11::string::operator+=(local_358,pcVar9);
          pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,pcVar9);
          this_local._4_4_ = STOP;
          damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ = 1;
          std::__cxx11::string::~string(local_358);
        }
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
        if (damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_01816fee;
      }
      do {
        (*egl_00->_vptr_Library[0x31])(egl_00,this->m_eglDisplay,this->m_eglSurface);
        dVar6 = (*egl_00->_vptr_Library[0x1f])();
        eglu::checkError(dVar6,"swapBuffers(m_eglDisplay, m_eglSurface)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                         ,0x244);
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
    }
LAB_01816fee:
    Frame::~Frame((Frame *)local_f8);
    tcu::Surface::~Surface
              ((Surface *)
               &newFrame.draws.
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::Surface::~Surface((Surface *)&refBuffer.m_pixels.m_cap);
    if (damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ != 0) goto LAB_018170c7;
  }
  if (bVar4) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_local._4_4_ = STOP;
    damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail, claim to support partial_update but buffer age is always 0");
    this_local._4_4_ = STOP;
    damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
LAB_018170c7:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&frameNdx);
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)&egl);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult PartialUpdateTest::iterate (void)
{
	de::Random		rnd				(m_seed);
	const Library&	egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log				= m_testCtx.getLog();
	const int		width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed		= rnd.getFloat();
	const float		clearGreen		= rnd.getFloat();
	const float		clearBlue		= rnd.getFloat();
	const tcu::Vec4	clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames		= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;
	bool			hasPositiveAge  = false;

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface	currentBuffer	 (width, height);
		tcu::Surface	refBuffer		 (width, height);
		Frame			newFrame		 (width, height);
		EGLint			currentBufferAge = -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		if (currentBufferAge > 0)
		{
			vector<EGLint>	damageRegion;

			hasPositiveAge = true;

			if (m_supportBufferAge)
			{
				damageRegion = getDamageRegion(newFrame, 10, 10, 10, 10);
			}
			else
			{
				damageRegion = getDamageRegion(newFrame, 0, 0, 0, 0);
				// Set empty damage region to avoid invalidating the framebuffer. The damage area is invalidated
				// if the buffer age extension is not supported.
				if (damageRegion.size() == 0)
					damageRegion = vector<EGLint>(4, 0);
			}

			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));
		}
		else
		{
			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0));
			clearColorScreen(m_gl, clearColor);
		}

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
			m_gles2Renderer->render(width, height, newFrame);
		else // do verification in the second half
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);

			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			m_gles2Renderer->render(width, height, newFrame);
			m_refRenderer->render(&refBuffer, newFrame);

			readPixels(m_gl, &currentBuffer);

			if (!compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx))
			{
				string errorMessage("Fail, render result is wrong. Buffer age is ");
				errorMessage += (m_supportBufferAge ? "supported" : "not supported");
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, errorMessage.c_str());
				return STOP;
			}
		}
		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));
	}

	if (!hasPositiveAge) // fraud behavior, pretend to support partial_update
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, claim to support partial_update but buffer age is always 0");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}